

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O1

void __thiscall
lunasvg::SVGPatternElement::SVGPatternElement(SVGPatternElement *this,Document *document)

{
  SVGElement::SVGElement((SVGElement *)this,document,Pattern);
  (this->super_SVGPaintElement).super_SVGElement.super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGPatternElement_0015a298;
  SVGURIReference::SVGURIReference(&this->super_SVGURIReference,(SVGElement *)this);
  (this->super_SVGPaintElement).super_SVGElement.super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGPatternElement_0015a298;
  SVGFitToViewBox::SVGFitToViewBox(&this->super_SVGFitToViewBox,(SVGElement *)this);
  (this->super_SVGPaintElement).super_SVGElement.super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGPatternElement_0015a298;
  SVGProperty::SVGProperty(&(this->m_x).super_SVGProperty,X);
  (this->m_x).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_x).super_SVGProperty.field_0x9 = 0;
  *(undefined4 *)&(this->m_x).super_SVGProperty.field_0xc = 0;
  (this->m_x).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_y).super_SVGProperty,Y);
  (this->m_y).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_y).super_SVGProperty.field_0x9 = 1;
  *(undefined4 *)&(this->m_y).super_SVGProperty.field_0xc = 0;
  (this->m_y).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_width).super_SVGProperty,Width);
  (this->m_width).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_width).super_SVGProperty.field_0x9 = 0x100;
  *(undefined4 *)&(this->m_width).super_SVGProperty.field_0xc = 0;
  (this->m_width).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_height).super_SVGProperty,Height);
  (this->m_height).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_height).super_SVGProperty.field_0x9 = 0x101;
  *(undefined4 *)&(this->m_height).super_SVGProperty.field_0xc = 0;
  (this->m_height).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_patternTransform).super_SVGProperty,PatternTransform);
  (this->m_patternTransform).super_SVGProperty._vptr_SVGProperty =
       (_func_int **)&PTR__SVGProperty_0015b070;
  Transform::Transform((Transform *)&(this->m_patternTransform).super_SVGProperty.field_0xc);
  SVGProperty::SVGProperty(&(this->m_patternUnits).super_SVGProperty,PatternUnits);
  (this->m_patternUnits).super_SVGProperty._vptr_SVGProperty =
       (_func_int **)&PTR__SVGProperty_00159390;
  (this->m_patternUnits).super_SVGProperty.field_0x9 = 1;
  SVGProperty::SVGProperty(&(this->m_patternContentUnits).super_SVGProperty,PatternContentUnits);
  (this->m_patternContentUnits).super_SVGProperty._vptr_SVGProperty =
       (_func_int **)&PTR__SVGProperty_00159390;
  (this->m_patternContentUnits).super_SVGProperty.field_0x9 = 0;
  SVGElement::addProperty((SVGElement *)this,&(this->m_x).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_y).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_width).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_height).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_patternTransform).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_patternUnits).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_patternContentUnits).super_SVGProperty);
  return;
}

Assistant:

SVGPatternElement::SVGPatternElement(Document* document)
    : SVGPaintElement(document, ElementID::Pattern)
    , SVGURIReference(this)
    , SVGFitToViewBox(this)
    , m_x(PropertyID::X, LengthDirection::Horizontal, LengthNegativeMode::Allow)
    , m_y(PropertyID::Y, LengthDirection::Vertical, LengthNegativeMode::Allow)
    , m_width(PropertyID::Width, LengthDirection::Horizontal, LengthNegativeMode::Forbid)
    , m_height(PropertyID::Height, LengthDirection::Vertical, LengthNegativeMode::Forbid)
    , m_patternTransform(PropertyID::PatternTransform)
    , m_patternUnits(PropertyID::PatternUnits, Units::ObjectBoundingBox)
    , m_patternContentUnits(PropertyID::PatternContentUnits, Units::UserSpaceOnUse)
{
    addProperty(m_x);
    addProperty(m_y);
    addProperty(m_width);
    addProperty(m_height);
    addProperty(m_patternTransform);
    addProperty(m_patternUnits);
    addProperty(m_patternContentUnits);
}